

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O1

int read_observation_records(ingest_info *info)

{
  coda_type_array *pcVar1;
  coda_type_record *definition;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ingest_info *piVar5;
  char cVar6;
  byte value;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  coda_mem_record *pcVar11;
  coda_mem_data *pcVar12;
  coda_mem_special *field_type;
  coda_mem_array *pcVar13;
  coda_mem_record *type;
  byte value_00;
  ulong uVar14;
  long lVar15;
  satellite_info *psVar16;
  char *message;
  ulong uVar17;
  long in_FS_OFFSET;
  bool bVar18;
  int num_satellites;
  char str_1 [17];
  int number;
  double double_value;
  char epoch_string [28];
  char str [61];
  char line [1000];
  char line_1 [1000];
  int local_8dc;
  ulong local_8d8;
  ingest_info *local_8d0;
  undefined2 local_8c8;
  undefined1 uStack_8c6;
  undefined4 uStack_8c5;
  undefined1 uStack_8c1;
  undefined4 uStack_8c0;
  undefined2 uStack_8bc;
  char cStack_8ba;
  char cStack_8b9;
  satellite_info *local_8b0;
  int local_8a8;
  uint8_t local_8a4 [4];
  coda_mem_record *local_8a0;
  double local_898;
  double local_890;
  satellite_info *local_888;
  satellite_info *local_880;
  satellite_info *local_878;
  satellite_info *local_870;
  undefined8 local_868 [2];
  undefined8 uStack_855;
  undefined1 local_84d;
  undefined2 local_848;
  undefined1 local_846;
  undefined1 local_845;
  char local_808 [2];
  undefined8 local_806;
  undefined8 uStack_7f3;
  char local_7e9;
  undefined2 local_7e8;
  undefined1 local_7e6;
  char local_7df [967];
  byte local_418;
  undefined2 local_417;
  undefined4 local_415 [249];
  
  lVar10 = ftell((FILE *)info->f);
  info->offset = lVar10;
  info->linenumber = info->linenumber + 1;
  uVar7 = get_line(info->f,local_808);
  if (-1 < (int)uVar7) {
    uVar14 = (ulong)uVar7;
    local_870 = &info->sbas;
    local_878 = &info->galileo;
    local_880 = &info->glonass;
    local_888 = &info->gps;
    do {
      if ((long)uVar14 < 1) {
        return 0;
      }
      if ((long)uVar14 < 0x23) {
        bVar18 = false;
        coda_set_error(-0x16,"record line length (%ld) too short (line: %ld, byte offset: %ld)",
                       uVar14,info->linenumber,info->offset);
      }
      else {
        local_8d8 = uVar14;
        if (local_808[0] == '>') {
          pcVar11 = coda_mem_record_new(info->epoch_record_definition,(coda_dynamic_type *)0x0);
          info->epoch_record = pcVar11;
          local_868[0] = local_806;
          uStack_855 = uStack_7f3;
          local_84d = 0;
          pcVar12 = coda_mem_string_new(*(coda_type_text **)
                                         (*(long *)(in_FS_OFFSET + -0x118) + 0x160),
                                        (coda_dynamic_type *)0x0,info->product,(char *)local_868);
          field_type = coda_mem_time_new(*(coda_type_special **)
                                          (*(long *)(in_FS_OFFSET + -0x118) + 0x168),
                                         (coda_dynamic_type *)0x0,(coda_dynamic_type *)pcVar12);
          coda_mem_record_add_field(info->epoch_record,"epoch",(coda_dynamic_type *)field_type,0);
          cVar6 = local_7e9;
          pcVar12 = coda_mem_char_new(*(coda_type_text **)(*(long *)(in_FS_OFFSET + -0x118) + 0x170)
                                      ,(coda_dynamic_type *)0x0,info->product,local_7e9);
          coda_mem_record_add_field(info->epoch_record,"flag",(coda_dynamic_type *)pcVar12,0);
          local_848 = local_7e8;
          local_846 = local_7e6;
          local_845 = 0;
          iVar8 = __isoc99_sscanf(&local_848,"%3d",&local_8dc);
          if (iVar8 != 1) {
            lVar15 = info->linenumber;
            lVar10 = info->offset + 0x22;
            message = 
            "invalid \'number of satellites\' entry in epoch record (line: %ld, byte offset: %ld)";
            goto LAB_001289c4;
          }
          if ((long)local_8d8 < 0x38) {
            local_898 = 0.0;
LAB_001289e7:
            pcVar12 = coda_mem_double_new(*(coda_type_number **)
                                           (*(long *)(in_FS_OFFSET + -0x118) + 0x178),
                                          (coda_dynamic_type *)0x0,info->product,local_898);
            coda_mem_record_add_field
                      (info->epoch_record,"receiver_clock_offset",(coda_dynamic_type *)pcVar12,0);
            pcVar1 = (info->gps).sat_obs_array_definition;
            if (pcVar1 != (coda_type_array *)0x0) {
              pcVar13 = coda_mem_array_new(pcVar1,(coda_dynamic_type *)0x0);
              (info->gps).sat_obs_array = pcVar13;
            }
            pcVar1 = (info->glonass).sat_obs_array_definition;
            if (pcVar1 != (coda_type_array *)0x0) {
              pcVar13 = coda_mem_array_new(pcVar1,(coda_dynamic_type *)0x0);
              (info->glonass).sat_obs_array = pcVar13;
            }
            pcVar1 = (info->galileo).sat_obs_array_definition;
            if (pcVar1 != (coda_type_array *)0x0) {
              pcVar13 = coda_mem_array_new(pcVar1,(coda_dynamic_type *)0x0);
              (info->galileo).sat_obs_array = pcVar13;
            }
            pcVar1 = (info->sbas).sat_obs_array_definition;
            if (pcVar1 != (coda_type_array *)0x0) {
              pcVar13 = coda_mem_array_new(pcVar1,(coda_dynamic_type *)0x0);
              (info->sbas).sat_obs_array = pcVar13;
            }
            if (cVar6 == '0') {
              if (0 < local_8dc) {
                iVar8 = 0;
                local_8d0 = info;
                do {
                  info = local_8d0;
                  lVar10 = ftell((FILE *)local_8d0->f);
                  info->offset = lVar10;
                  info->linenumber = info->linenumber + 1;
                  iVar9 = get_line(info->f,(char *)&local_418);
                  if (iVar9 < 0) goto LAB_001289cb;
                  if (local_418 < 0x52) {
                    psVar16 = local_878;
                    if ((local_418 != 0x45) && (psVar16 = local_888, local_418 != 0x47)) {
LAB_00128fd3:
                      coda_set_error(-0x16,
                                     "invalid satellite system for epoch record (line: %ld, byte offset: %ld)"
                                     ,info->linenumber,info->offset);
                      goto LAB_001289cb;
                    }
                  }
                  else {
                    psVar16 = local_870;
                    if ((local_418 != 0x53) && (psVar16 = local_880, local_418 != 0x52))
                    goto LAB_00128fd3;
                  }
                  if (psVar16->sat_obs_array == (coda_mem_array *)0x0) {
                    coda_set_error(-0x16,
                                   "satellite system \'%c\' was not defined in header for this observation record (line: %ld, byte offset: %ld)"
                                   ,(ulong)(uint)(int)(char)local_418,info->linenumber,info->offset)
                    ;
                    goto LAB_001289cb;
                  }
                  definition = psVar16->sat_obs_definition;
                  if (definition == (coda_type_record *)0x0) {
                    __assert_fail("sat_info->sat_obs_definition != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-rinex.c"
                                  ,0x96e,"int read_observation_record_for_satellite(ingest_info *)")
                    ;
                  }
                  uVar14 = (ulong)iVar9;
                  uVar17 = (long)psVar16->num_observables << 4;
                  uVar7 = (uint)uVar17;
                  local_8b0 = psVar16;
                  local_8a8 = iVar8;
                  if (((int)uVar7 < iVar9) && (uVar17 = uVar17 | 3, iVar9 < (int)uVar17)) {
                    memset(&local_418 + uVar14,0x20,uVar17 - uVar14);
                    uVar14 = uVar17;
                  }
                  if ((long)uVar14 < (long)(int)(uVar7 | 3)) {
                    coda_set_error(-0x16,
                                   "epoch line length (%ld) too short (line: %ld, byte offset: %ld)"
                                   ,uVar14,info->linenumber,info->offset);
                    goto LAB_001289cb;
                  }
                  pcVar11 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
                  local_8c8 = local_417;
                  uStack_8c6 = 0;
                  iVar8 = __isoc99_sscanf(&local_8c8,"%2d",local_8a4);
                  if (iVar8 != 1) {
                    coda_dynamic_type_delete((coda_dynamic_type *)pcVar11);
                    info = local_8d0;
                    coda_set_error(-0x16,"invalid satellite number (line: %ld, byte offset: %ld)",
                                   local_8d0->linenumber,local_8d0->offset + 1);
                    goto LAB_001289cb;
                  }
                  pcVar12 = coda_mem_uint8_new(*(coda_type_number **)
                                                (*(long *)(in_FS_OFFSET + -0x118) + 0x180),
                                               (coda_dynamic_type *)0x0,local_8d0->product,
                                               local_8a4[0]);
                  coda_mem_record_add_field(pcVar11,"number",(coda_dynamic_type *)pcVar12,0);
                  if (0 < local_8b0->num_observables) {
                    uVar14 = 0;
                    lVar10 = 0;
                    local_8a0 = pcVar11;
                    do {
                      uVar2 = *(undefined4 *)((long)local_415 + uVar14);
                      uVar3 = *(undefined4 *)((long)local_415 + uVar14 + 4);
                      uStack_8c0 = *(undefined4 *)((long)local_415 + uVar14 + 8);
                      uVar4 = *(undefined4 *)((long)local_415 + uVar14 + 0xc);
                      local_8c8 = (undefined2)uVar2;
                      uStack_8c6 = (undefined1)((uint)uVar2 >> 0x10);
                      uStack_8c5._1_3_ = (undefined3)uVar3;
                      uStack_8c5 = CONCAT31(uStack_8c5._1_3_,(char)((uint)uVar2 >> 0x18));
                      uStack_8c1 = (undefined1)((uint)uVar3 >> 0x18);
                      uStack_8bc = (undefined2)uVar4;
                      cStack_8ba = (char)((uint)uVar4 >> 0x10);
                      cStack_8b9 = (char)((uint)uVar4 >> 0x18);
                      value = cStack_8ba - 0x30;
                      if (9 < value) {
                        value = 0;
                      }
                      value_00 = cStack_8b9 - 0x30;
                      if (9 < value_00) {
                        value_00 = 0;
                      }
                      cStack_8ba = 0;
                      iVar8 = __isoc99_sscanf(&local_8c8,"%lf",&local_890);
                      if (iVar8 != 1) {
                        if (CONCAT17(cStack_8ba,CONCAT25(uStack_8bc,CONCAT41(uStack_8c0,uStack_8c1))
                                    ) != 0x20202020202020 ||
                            CONCAT17(uStack_8c1,CONCAT43(uStack_8c5,CONCAT12(uStack_8c6,local_8c8)))
                            != 0x2020202020202020) {
                          coda_dynamic_type_delete((coda_dynamic_type *)local_8a0);
                          info = local_8d0;
                          coda_set_error(-0x16,
                                         "invalid observation value (line: %ld, byte offset: %ld)",
                                         local_8d0->linenumber,
                                         local_8d0->offset + (uVar14 & 0xffffffff) + 3);
                          goto LAB_001289cb;
                        }
                        local_890 = 0.0;
                      }
                      type = coda_mem_record_new(*(coda_type_record **)
                                                  (*(long *)(in_FS_OFFSET + -0x118) + 0x1a0),
                                                 (coda_dynamic_type *)0x0);
                      piVar5 = local_8d0;
                      pcVar12 = coda_mem_double_new(*(coda_type_number **)
                                                     (*(long *)(in_FS_OFFSET + -0x118) + 0x188),
                                                    (coda_dynamic_type *)0x0,local_8d0->product,
                                                    local_890);
                      coda_mem_record_add_field(type,"observation",(coda_dynamic_type *)pcVar12,0);
                      pcVar12 = coda_mem_uint8_new(*(coda_type_number **)
                                                    (*(long *)(in_FS_OFFSET + -0x118) + 400),
                                                   (coda_dynamic_type *)0x0,piVar5->product,value);
                      coda_mem_record_add_field(type,"lli",(coda_dynamic_type *)pcVar12,0);
                      pcVar12 = coda_mem_uint8_new(*(coda_type_number **)
                                                    (*(long *)(in_FS_OFFSET + -0x118) + 0x198),
                                                   (coda_dynamic_type *)0x0,piVar5->product,value_00
                                                  );
                      coda_mem_record_add_field
                                (type,"signal_strength",(coda_dynamic_type *)pcVar12,0);
                      pcVar11 = local_8a0;
                      psVar16 = local_8b0;
                      coda_mem_record_add_field
                                (local_8a0,local_8b0->observable[lVar10],(coda_dynamic_type *)type,0
                                );
                      lVar10 = lVar10 + 1;
                      uVar14 = uVar14 + 0x10;
                    } while (lVar10 < psVar16->num_observables);
                  }
                  coda_mem_array_add_element(local_8b0->sat_obs_array,(coda_dynamic_type *)pcVar11);
                  iVar8 = local_8a8 + 1;
                  info = local_8d0;
                } while (iVar8 < local_8dc);
              }
            }
            else if (0 < local_8dc) {
              iVar8 = 0;
              do {
                lVar10 = ftell((FILE *)info->f);
                info->offset = lVar10;
                info->linenumber = info->linenumber + 1;
                iVar9 = get_line(info->f,local_808);
                if (iVar9 < 0) {
                  uVar14 = (ulong)iVar9;
                  bVar18 = false;
                  goto LAB_001289d0;
                }
                iVar8 = iVar8 + 1;
              } while (iVar8 < local_8dc);
            }
            pcVar13 = (info->gps).sat_obs_array;
            if (pcVar13 != (coda_mem_array *)0x0) {
              coda_mem_record_add_field(info->epoch_record,"gps",(coda_dynamic_type *)pcVar13,0);
              (info->gps).sat_obs_array = (coda_mem_array *)0x0;
            }
            pcVar13 = (info->glonass).sat_obs_array;
            if (pcVar13 != (coda_mem_array *)0x0) {
              coda_mem_record_add_field(info->epoch_record,"glonass",(coda_dynamic_type *)pcVar13,0)
              ;
              (info->glonass).sat_obs_array = (coda_mem_array *)0x0;
            }
            pcVar13 = (info->galileo).sat_obs_array;
            if (pcVar13 != (coda_mem_array *)0x0) {
              coda_mem_record_add_field(info->epoch_record,"galileo",(coda_dynamic_type *)pcVar13,0)
              ;
              (info->galileo).sat_obs_array = (coda_mem_array *)0x0;
            }
            pcVar13 = (info->sbas).sat_obs_array;
            if (pcVar13 != (coda_mem_array *)0x0) {
              coda_mem_record_add_field(info->epoch_record,"sbas",(coda_dynamic_type *)pcVar13,0);
              (info->sbas).sat_obs_array = (coda_mem_array *)0x0;
            }
            coda_mem_array_add_element(info->records,(coda_dynamic_type *)info->epoch_record);
            info->epoch_record = (coda_mem_record *)0x0;
            lVar10 = ftell((FILE *)info->f);
            info->offset = lVar10;
            info->linenumber = info->linenumber + 1;
            iVar8 = get_line(info->f,local_808);
            uVar14 = (ulong)iVar8;
            bVar18 = -1 < iVar8;
            goto LAB_001289d0;
          }
          lVar10 = coda_ascii_parse_double(local_7df,0xf,&local_898,0);
          if (-1 < lVar10) goto LAB_001289e7;
          coda_add_error_message(" (line: %ld, byte offset: %ld)",info->linenumber,info->offset);
        }
        else {
          lVar15 = info->linenumber;
          lVar10 = info->offset;
          message = "expected \'>\' as start of epoch record (line: %ld, byte offset: %ld)";
LAB_001289c4:
          coda_set_error(-0x16,message,lVar15,lVar10);
        }
LAB_001289cb:
        bVar18 = false;
        uVar14 = local_8d8;
      }
LAB_001289d0:
    } while (bVar18);
  }
  return -1;
}

Assistant:

static int read_observation_records(ingest_info *info)
{
    char line[MAX_LINE_LENGTH];
    long linelength;
    double double_value;
    char str[61];
    int i;

    info->offset = ftell(info->f);
    info->linenumber++;
    linelength = get_line(info->f, line);
    if (linelength < 0)
    {
        return -1;
    }
    while (linelength > 0)
    {
        coda_dynamic_type *base_type;
        coda_dynamic_type *value;
        coda_type *rtype;
        char epoch_string[28];
        char epoch_flag;
        int num_satellites;

        if (linelength < 35)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "record line length (%ld) too short (line: %ld, byte offset: %ld)",
                           linelength, info->linenumber, info->offset);
            return -1;
        }
        if (line[0] != '>')
        {
            coda_set_error(CODA_ERROR_FILE_READ, "expected '>' as start of epoch record (line: %ld, byte offset: %ld)",
                           info->linenumber, info->offset);
            return -1;
        }

        info->epoch_record = coda_mem_record_new(info->epoch_record_definition, NULL);

        memcpy(epoch_string, &line[2], 27);
        epoch_string[27] = '\0';
        rtype = rinex_type[rinex_epoch_string];
        base_type = (coda_dynamic_type *)coda_mem_string_new((coda_type_text *)rtype, NULL, info->product,
                                                             epoch_string);
        rtype = rinex_type[rinex_obs_epoch];
        value = (coda_dynamic_type *)coda_mem_time_new((coda_type_special *)rtype, NULL, base_type);
        coda_mem_record_add_field(info->epoch_record, "epoch", value, 0);

        epoch_flag = line[31];
        rtype = rinex_type[rinex_obs_epoch_flag];
        value = (coda_dynamic_type *)coda_mem_char_new((coda_type_text *)rtype, NULL, info->product, epoch_flag);
        coda_mem_record_add_field(info->epoch_record, "flag", value, 0);

        memcpy(str, &line[32], 3);
        str[3] = '\0';
        if (sscanf(str, "%3d", &num_satellites) != 1)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "invalid 'number of satellites' entry in epoch record "
                           "(line: %ld, byte offset: %ld)", info->linenumber, info->offset + 34);
            return -1;
        }

        if (linelength >= 56)
        {
            if (coda_ascii_parse_double(&line[41], 15, &double_value, 0) < 0)
            {
                coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset);
                return -1;
            }
        }
        else
        {
            double_value = 0;
        }
        rtype = rinex_type[rinex_receiver_clock_offset];
        value = (coda_dynamic_type *)coda_mem_double_new((coda_type_number *)rtype, NULL, info->product, double_value);
        coda_mem_record_add_field(info->epoch_record, "receiver_clock_offset", value, 0);

        if (info->gps.sat_obs_array_definition != NULL)
        {
            info->gps.sat_obs_array = coda_mem_array_new(info->gps.sat_obs_array_definition, NULL);
        }
        if (info->glonass.sat_obs_array_definition != NULL)
        {
            info->glonass.sat_obs_array = coda_mem_array_new(info->glonass.sat_obs_array_definition, NULL);
        }
        if (info->galileo.sat_obs_array_definition != NULL)
        {
            info->galileo.sat_obs_array = coda_mem_array_new(info->galileo.sat_obs_array_definition, NULL);
        }
        if (info->sbas.sat_obs_array_definition != NULL)
        {
            info->sbas.sat_obs_array = coda_mem_array_new(info->sbas.sat_obs_array_definition, NULL);
        }

        /* check epoch flag */
        if (epoch_flag != '0')
        {
            /* we skip the remaining part of this record if epoch flag != 0 */
            for (i = 0; i < num_satellites; i++)
            {
                info->offset = ftell(info->f);
                info->linenumber++;
                linelength = get_line(info->f, line);
                if (linelength < 0)
                {
                    return -1;
                }
            }
        }
        else
        {
            for (i = 0; i < num_satellites; i++)
            {
                if (read_observation_record_for_satellite(info) != 0)
                {
                    return -1;
                }
            }
        }

        if (info->gps.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "gps", (coda_dynamic_type *)info->gps.sat_obs_array, 0);
            info->gps.sat_obs_array = NULL;
        }
        if (info->glonass.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "glonass", (coda_dynamic_type *)info->glonass.sat_obs_array,
                                      0);
            info->glonass.sat_obs_array = NULL;
        }
        if (info->galileo.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "galileo", (coda_dynamic_type *)info->galileo.sat_obs_array,
                                      0);
            info->galileo.sat_obs_array = NULL;
        }
        if (info->sbas.sat_obs_array != NULL)
        {
            coda_mem_record_add_field(info->epoch_record, "sbas", (coda_dynamic_type *)info->sbas.sat_obs_array, 0);
            info->sbas.sat_obs_array = NULL;
        }
        coda_mem_array_add_element(info->records, (coda_dynamic_type *)info->epoch_record);
        info->epoch_record = NULL;

        info->offset = ftell(info->f);
        info->linenumber++;
        linelength = get_line(info->f, line);
        if (linelength < 0)
        {
            return -1;
        }
    }

    return 0;
}